

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.hpp
# Opt level: O0

void __thiscall cinatra::cookie::cookie(cookie *this,string *name,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  allocator<char> *__s;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [37];
  
  std::__cxx11::string::string(in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string(in_RDI,in_stack_ffffffffffffffb8);
  __a = in_RDI + 2;
  __s = local_25;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::~allocator(local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::~allocator(&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::~allocator(&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::~allocator(&local_28);
  in_RDI[6]._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  *(undefined4 *)&in_RDI[6]._M_string_length = 0;
  *(undefined1 *)((long)&in_RDI[6]._M_string_length + 4) = 0;
  *(undefined1 *)((long)&in_RDI[6]._M_string_length + 5) = 0;
  return;
}

Assistant:

cookie(const std::string &name, const std::string &value)
      : name_(name), value_(value) {}